

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void vrna_init_rand(void)

{
  uint32_t uVar1;
  clock_t cVar2;
  time_t tVar3;
  uint32_t seed;
  
  cVar2 = clock();
  tVar3 = time((time_t *)0x0);
  uVar1 = getpid();
  uVar1 = rj_mix((uint32_t)cVar2,(uint32_t)tVar3,uVar1);
  xsubi[0] = (unsigned_short)uVar1;
  xsubi[1] = xsubi[0] + (short)(uVar1 >> 6);
  xsubi[2] = xsubi[0] + (short)(uVar1 >> 0xc);
  srand(uVar1);
  return;
}

Assistant:

PUBLIC void
vrna_init_rand(void)
{
  uint32_t seed = rj_mix(clock(), time(NULL), getpid());

  xsubi[0]  = xsubi[1] = xsubi[2] = (unsigned short)seed;  /* lower 16 bit */
  xsubi[1]  += (unsigned short)((unsigned)seed >> 6);
  xsubi[2]  += (unsigned short)((unsigned)seed >> 12);
#ifndef HAVE_ERAND48
  srand((unsigned int)seed);
#endif
}